

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall chrono::ChSystem::Setup(ChSystem *this)

{
  element_type *peVar1;
  int iVar2;
  rep_conflict rVar3;
  long lVar4;
  
  utils::ChProfileManager::Start_Profile("Setup");
  rVar3 = std::chrono::_V2::system_clock::now();
  (this->timer_setup).m_start.__d.__r = rVar3;
  this->ncoords = 0;
  this->ndoc = 0;
  this->ncoords_w = 0;
  this->ndoc_w = 0;
  this->ndoc_w_C = 0;
  this->ndoc_w_D = 0;
  ChAssembly::Setup(&this->assembly);
  iVar2 = (this->assembly).ncoords_w;
  this->ncoords = this->ncoords + (this->assembly).ncoords;
  this->ncoords_w = this->ncoords_w + iVar2;
  iVar2 = this->ndoc_w + (this->assembly).ndoc_w;
  this->ndoc_w = iVar2;
  this->ndoc_w_C = this->ndoc_w_C + (this->assembly).ndoc_w_C;
  this->ndoc_w_D = this->ndoc_w_D + (this->assembly).ndoc_w_D;
  peVar1 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->super_ChPhysicsItem).offset_L = iVar2 + (this->assembly).super_ChPhysicsItem.offset_L;
  iVar2 = (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x18])();
  this->ndoc_w = this->ndoc_w + iVar2;
  iVar2 = (*(((this->contact_container).
              super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x19])();
  this->ndoc_w_C = this->ndoc_w_C + iVar2;
  iVar2 = (*(((this->contact_container).
              super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1a])();
  this->ndoc_w_D = this->ndoc_w_D + iVar2;
  iVar2 = (this->assembly).nbodies + this->ndoc_w;
  this->ndoc = iVar2;
  this->nsysvars = this->ncoords + iVar2;
  this->nsysvars_w = this->ndoc_w + this->ncoords_w;
  this->ndof = this->ncoords - iVar2;
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->timer_setup).m_end.__d.__r = lVar4;
  (this->timer_setup).m_total.__r =
       (double)(lVar4 - (this->timer_setup).m_start.__d.__r) / 1000000000.0 +
       (this->timer_setup).m_total.__r;
  utils::ChProfileManager::Stop_Profile();
  return;
}

Assistant:

void ChSystem::Setup() {
    CH_PROFILE("Setup");

    timer_setup.start();

    ncoords = 0;
    ncoords_w = 0;
    ndoc = 0;
    ndoc_w = 0;
    ndoc_w_C = 0;
    ndoc_w_D = 0;

    // Set up the underlying assembly (compute offsets of bodies, links, etc.)
    assembly.Setup();
    ncoords += assembly.ncoords;
    ncoords_w += assembly.ncoords_w;
    ndoc_w += assembly.ndoc_w;
    ndoc_w_C += assembly.ndoc_w_C;
    ndoc_w_D += assembly.ndoc_w_D;

    // Compute offsets for contact container
    contact_container->SetOffset_L(assembly.offset_L + ndoc_w);
    ndoc_w += contact_container->GetDOC();
    ndoc_w_C += contact_container->GetDOC_c();
    ndoc_w_D += contact_container->GetDOC_d();

    ndoc = ndoc_w + assembly.nbodies;  // number of constraints including quaternion constraints.
    nsysvars = ncoords + ndoc;         // total number of variables (coordinates + lagrangian multipliers)
    nsysvars_w = ncoords_w + ndoc_w;   // total number of variables (with 6 dof per body)

    ndof = ncoords - ndoc;  // number of degrees of freedom (approximate - does not consider constr. redundancy, etc)

    timer_setup.stop();

#ifdef _DEBUG
    // BOOKKEEPING SANITY CHECK
    // Test if the bookkeeping is properly aligned, at least for state gather/scatters,
    // by filling a marked vector, and see if some gaps or overlaps are remaining.

    bool check_bookkeeping = false;
    if (check_bookkeeping) {
        ChState test_x(GetNcoords_x(), this);
        ChStateDelta test_v(GetNcoords_w(), this);
        ChStateDelta test_a(GetNcoords_w(), this);
        ChVectorDynamic<> test_L(GetNconstr());
        double poison_x = -8888.888;
        double poison_v = -9999.999;
        double poison_a = -7777.777;
        double poison_L = 55555.555;
        double test_T;
        test_x.setConstant(poison_x);  // poison x
        test_v.setConstant(poison_v);  // poison v
        test_a.setConstant(poison_a);  // poison a
        test_L.setConstant(poison_L);  // poison L
        StateGather(test_x, test_v, test_T);
        StateGatherAcceleration(test_a);
        StateGatherReactions(test_L);
        for (int i = 0; i < test_x.size(); ++i)
            assert(test_x(i) != poison_x);  // if your debugger breaks here, some ChPhysicsItem has a wrong
                                            // implementation of offsets or DOFs for positions
        for (int i = 0; i < test_v.size(); ++i)
            assert(test_v(i) != poison_v);  // if your debugger breaks here, some ChPhysicsItem has a wrong
                                            // implementation of offsets or DOFs for velocities
        for (int i = 0; i < test_a.size(); ++i)
            assert(test_a(i) != poison_a);  // if your debugger breaks here, some ChPhysicsItem has a wrong
                                            // implementation of offsets or DOFs for accelerations
        for (int i = 0; i < test_L.size(); ++i)
            assert(test_L(i) != poison_L);  // if your debugger breaks here, some ChPhysicsItem has a wrong
                                            // implementation of offsets or DOFs for reaction forces
    }
#endif  // _DEBUG
}